

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O2

void * pool_alloc(pool *p,size_t sz)

{
  void *pvVar1;
  chunk *pcVar2;
  ulong uVar3;
  ulong sz_00;
  
  sz_00 = sz + 7 & 0xfffffffffffffff8;
  if (sz < 0x3e1) {
    pcVar2 = p->current;
    if (pcVar2 == (chunk *)0x0) {
      pvVar1 = pool_newchunk(p,1000);
      if (pvVar1 == (void *)0x0) {
        return (void *)0x0;
      }
      pcVar2 = p->header;
      p->current = pcVar2;
    }
    uVar3 = (ulong)p->current_used;
    if (sz_00 + uVar3 < 0x3e9) {
      pvVar1 = (void *)((long)&pcVar2[1].next + uVar3);
      p->current_used = (int)(sz_00 + uVar3);
    }
    else {
      if (uVar3 <= sz_00) goto LAB_001224e8;
      pvVar1 = pool_newchunk(p,1000);
      p->current = p->header;
      p->current_used = (int)sz_00;
    }
    return pvVar1;
  }
LAB_001224e8:
  pvVar1 = pool_newchunk(p,sz_00);
  return pvVar1;
}

Assistant:

static void *
pool_alloc(struct pool *p, size_t sz) {
	// align by 8
	sz = (sz + 7) & ~7;
	if (sz >= CHUNK_SIZE) {
		return pool_newchunk(p, sz);
	}
	if (p->current == NULL) {
		if (pool_newchunk(p, CHUNK_SIZE) == NULL)
			return NULL;
		p->current = p->header;
	}
	if (sz + p->current_used <= CHUNK_SIZE) {
		void * ret = (char *)(p->current+1) + p->current_used;
		p->current_used += sz;
		return ret;
	}

	if (sz >= p->current_used) {
		return pool_newchunk(p, sz);
	} else {
		void * ret = pool_newchunk(p, CHUNK_SIZE);
		p->current = p->header;
		p->current_used = sz;
		return ret;
	}
}